

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_column_mapper.cpp
# Opt level: O3

void __thiscall duckdb::FieldIdMapper::~FieldIdMapper(FieldIdMapper *this)

{
  (this->super_ColumnMapper)._vptr_ColumnMapper = (_func_int **)&PTR__FieldIdMapper_0245d220;
  ::std::
  _Hashtable<int,_std::pair<const_int,_duckdb::MultiFileLocalColumnId>,_std::allocator<std::pair<const_int,_duckdb::MultiFileLocalColumnId>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->field_id_map)._M_h);
  operator_delete(this);
  return;
}

Assistant:

explicit FieldIdMapper(const vector<MultiFileColumnDefinition> &columns) {
		for (idx_t col_idx = 0; col_idx < columns.size(); col_idx++) {
			auto &column = columns[col_idx];
			if (column.identifier.IsNull()) {
				// Extra columns at the end will not have a field_id
				break;
			}
			auto field_id = column.GetIdentifierFieldId();
			field_id_map.emplace(field_id, MultiFileLocalColumnId(col_idx));
		}
	}